

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O0

void __thiscall
density::detail::SpinlockMutex<density::default_busy_wait>::SpinlockMutex
          (SpinlockMutex<density::default_busy_wait> *this,default_busy_wait *i_busy_wait)

{
  default_busy_wait *i_busy_wait_local;
  SpinlockMutex<density::default_busy_wait> *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->m_lock).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

SpinlockMutex(const BUSY_WAIT_FUNC & i_busy_wait) : BUSY_WAIT_FUNC(i_busy_wait)
            {
                m_lock.clear();
            }